

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

void __thiscall OpenMD::MoleculeStamp::checkBends(MoleculeStamp *this)

{
  int iVar1;
  _Head_base<2UL,_int,_false> _Var2;
  _Rb_tree_color _Var3;
  _Rb_tree_color _Var4;
  long lVar5;
  pointer piVar6;
  pointer ppBVar7;
  BondStamp *pBVar8;
  pointer ppAVar9;
  AtomStamp *this_00;
  AtomStamp *this_01;
  bool bVar10;
  _Rb_tree_color _Var11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  long lVar14;
  pointer piVar15;
  pointer ppBVar16;
  iterator iVar17;
  BendStamp *pBVar18;
  ostream *poVar19;
  OpenMDException *pOVar20;
  int __tmp;
  pointer ppBVar21;
  vector<int,_std::allocator<int>_> *cont;
  vector<int,_std::allocator<int>_> *cont_00;
  vector<int,_std::allocator<int>_> *cont_01;
  vector<int,_std::allocator<int>_> *cont_02;
  ulong uVar22;
  long lVar23;
  set<std::tuple<int,_int,_int>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
  allBends;
  size_t ghostIndex;
  _Head_base<0UL,_int,_false> local_228;
  vector<int,_std::allocator<int>_> bendAtoms;
  tuple<int,_int,_int> bendTuple;
  vector<int,_std::allocator<int>_> rigidSet;
  _Bind<std::less<int>_(std::_Placeholder<1>,_int)> local_1c0;
  _Bind<std::greater<int>_(std::_Placeholder<1>,_unsigned_long)> local_1b8;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  lVar23 = 0;
  uVar22 = 0;
  do {
    ppBVar16 = (this->bendStamps_).
               super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppBVar21 = (this->bendStamps_).
               super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppBVar21 - (long)ppBVar16 >> 3) <= uVar22) {
      uVar22 = 0;
      do {
        if ((ulong)((long)ppBVar21 - (long)ppBVar16 >> 3) <= uVar22) {
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &allBends._M_t._M_impl.super__Rb_tree_header._M_header;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          allBends._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          lVar23 = 0;
          uVar22 = 0;
          allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               allBends._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          while( true ) {
            if ((ulong)((long)ppBVar21 - (long)ppBVar16 >> 3) <= uVar22) {
              for (uVar22 = 0;
                  ppBVar7 = (this->bondStamps_).
                            super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  uVar22 < (ulong)((long)(this->bondStamps_).
                                         super__Vector_base<OpenMD::BondStamp_*,_std::allocator<OpenMD::BondStamp_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar7
                                  >> 3); uVar22 = uVar22 + 1) {
                pBVar8 = ppBVar7[(int)uVar22];
                _Var3 = pBVar8->a;
                _Var4 = pBVar8->b;
                ppAVar9 = (this->atomStamps_).
                          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                this_00 = ppAVar9[(int)_Var3];
                this_01 = ppAVar9[(int)_Var4];
                bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left;
                _Var11 = ~_S_red;
                if ((_Rb_tree_header *)
                    bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    &(this_00->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header) {
                  _Var11 = ((_Base_ptr)
                           ((long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 0x20))->_M_color;
                }
                while (_Var11 != ~_S_red) {
                  if (_Var4 != _Var11) {
                    ghostIndex = CONCAT44(_Var3,_Var4);
                    local_228._M_head_impl = _Var11;
                    iVar17 = std::
                             _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                             ::find(&allBends._M_t,(key_type *)&ghostIndex);
                    if ((_Rb_tree_header *)iVar17._M_node ==
                        &allBends._M_t._M_impl.super__Rb_tree_header) {
                      std::
                      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                      ::_M_insert_unique<std::tuple<int,int,int>const&>
                                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                                  *)&allBends,(tuple<int,_int,_int> *)&ghostIndex);
                      pBVar18 = (BendStamp *)operator_new(0xf0);
                      BendStamp::BendStamp(pBVar18);
                      BendStamp::setMembers(pBVar18,(tuple<int,_int,_int> *)&ghostIndex);
                      addBendStamp(this,pBVar18);
                    }
                  }
                  _Var11 = AtomStamp::getNextBondedAtom(this_00,(AtomIter *)&bendAtoms);
                }
                bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)(this_01->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_left;
                _Var11 = ~_S_red;
                if ((_Rb_tree_header *)
                    bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    &(this_01->bondedAtoms_)._M_t._M_impl.super__Rb_tree_header) {
                  _Var11 = ((_Base_ptr)
                           ((long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 0x20))->_M_color;
                }
                while (_Var11 != ~_S_red) {
                  if (_Var3 != _Var11) {
                    ghostIndex = CONCAT44(_Var4,_Var11);
                    local_228._M_head_impl = _Var3;
                    iVar17 = std::
                             _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                             ::find(&allBends._M_t,(key_type *)&ghostIndex);
                    if ((_Rb_tree_header *)iVar17._M_node ==
                        &allBends._M_t._M_impl.super__Rb_tree_header) {
                      std::
                      _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                      ::_M_insert_unique<std::tuple<int,int,int>const&>
                                ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                                  *)&allBends,(tuple<int,_int,_int> *)&ghostIndex);
                      pBVar18 = (BendStamp *)operator_new(0xf0);
                      BendStamp::BendStamp(pBVar18);
                      BendStamp::setMembers(pBVar18,(tuple<int,_int,_int> *)&ghostIndex);
                      addBendStamp(this,pBVar18);
                    }
                  }
                  _Var11 = AtomStamp::getNextBondedAtom(this_01,(AtomIter *)&bendAtoms);
                }
              }
              std::
              _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
              ::~_Rb_tree(&allBends._M_t);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
              return;
            }
            lVar5 = *(long *)((long)ppBVar16 + (lVar23 >> 0x1d));
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)
                       &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                       (vector<int,_std::allocator<int>_> *)(lVar5 + 0x98));
            if ((long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == 8) {
              ghostIndex = CONCAT44(ghostIndex._4_4_,*(undefined4 *)(lVar5 + 0x94));
              _Var12 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 (rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,&ghostIndex);
              if (_Var12._M_current !=
                  rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<int,_std::allocator<int>_>::insert
                          ((vector<int,_std::allocator<int>_> *)
                           &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                           (const_iterator)_Var12._M_current,(value_type_conflict2 *)&ghostIndex);
              }
            }
            _Var2._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[2];
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Head_base<1UL,_int,_false>._M_head_impl =
                 rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
            _M_head_impl = *rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
            bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                 (_Head_base<2UL,_int,_false>)(_Head_base<2UL,_int,_false>)_Var2._M_head_impl;
            if (_Var2._M_head_impl <
                bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
                _M_head_impl) {
              bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
              super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
                   (_Head_base<2UL,_int,_false>)
                   (_Head_base<2UL,_int,_false>)
                   bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>
                   ._M_head_impl;
              bendTuple.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
              _M_head_impl = _Var2._M_head_impl;
            }
            iVar17 = std::
                     _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                     ::find((_Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_std::less<std::tuple<int,_int,_int>_>,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&allBends,&bendTuple);
            if ((_Rb_tree_header *)iVar17._M_node != &allBends._M_t._M_impl.super__Rb_tree_header)
            break;
            std::
            _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
            ::_M_insert_unique<std::tuple<int,int,int>const&>
                      ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,std::less<std::tuple<int,int,int>>,std::allocator<std::tuple<int,int,int>>>
                        *)&allBends,&bendTuple);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
            uVar22 = uVar22 + 1;
            ppBVar16 = (this->bendStamps_).
                       super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppBVar21 = (this->bendStamps_).
                       super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            lVar23 = lVar23 + 0x100000000;
          }
          poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
          std::__cxx11::string::string((string *)&ghostIndex,(string *)&(this->Name).data_);
          poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
          poVar19 = std::operator<<(poVar19,": ");
          poVar19 = std::operator<<(poVar19,"Bend");
          containerToString<std::vector<int,std::allocator<int>>>
                    ((string *)&bendAtoms,(OpenMD *)&rigidSet,cont_02);
          poVar19 = std::operator<<(poVar19,(string *)&bendAtoms);
          std::operator<<(poVar19," appears multiple times\n");
          std::__cxx11::string::~string((string *)&bendAtoms);
          std::__cxx11::string::~string((string *)&ghostIndex);
          pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
          std::__cxx11::stringbuf::str();
          OpenMDException::OpenMDException(pOVar20,(string *)&ghostIndex);
          __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
        }
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &bendAtoms.super__Vector_base<int,_std::allocator<int>_>,
                   &ppBVar16[(int)uVar22]->members_);
        allBends._M_t._M_impl._0_4_ = 0;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)
                   &rigidSet.super__Vector_base<int,_std::allocator<int>_>,
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->rigidBodyStamps_).
                         super__Vector_base<OpenMD::RigidBodyStamp_*,_std::allocator<OpenMD::RigidBodyStamp_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,
                   (value_type_conflict2 *)&allBends,(allocator_type *)&ghostIndex);
        piVar6 = (this->atom2Rigidbody).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (piVar15 = bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
            piVar15 !=
            bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish; piVar15 = piVar15 + 1) {
          lVar23 = (long)piVar6[*piVar15];
          if ((-1 < lVar23) &&
             (iVar1 = rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar23],
             rigidSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar23] = iVar1 + 1, 1 < iVar1)) {
            poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
            std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
            poVar19 = std::operator<<(poVar19,(string *)&allBends);
            poVar19 = std::operator<<(poVar19,": bend");
            containerToString<std::vector<int,std::allocator<int>>>
                      ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont);
            poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
            std::operator<<(poVar19,"has three atoms on the same rigid body\n");
            std::__cxx11::string::~string((string *)&ghostIndex);
            std::__cxx11::string::~string((string *)&allBends);
            pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
            __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
          }
        }
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&rigidSet.super__Vector_base<int,_std::allocator<int>_>);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
        uVar22 = uVar22 + 1;
        ppBVar16 = (this->bendStamps_).
                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppBVar21 = (this->bendStamps_).
                   super__Vector_base<OpenMD::BendStamp_*,_std::allocator<OpenMD::BendStamp_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      } while( true );
    }
    lVar5 = *(long *)((long)ppBVar16 + (lVar23 >> 0x1d));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)
               &bendAtoms.super__Vector_base<int,_std::allocator<int>_>,
               (vector<int,_std::allocator<int>_> *)(lVar5 + 0x98));
    local_1b8._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>.
    super__Tuple_impl<1UL,_unsigned_long>.super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_unsigned_long>)
         (((long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->atomStamps_).
                 super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) - 1);
    _Var12 = std::
             find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_1b8);
    local_1c0._M_bound_args.super__Tuple_impl<0UL,_std::_Placeholder<1>,_int>.
    super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl =
         (_Tuple_impl<0UL,_std::_Placeholder<1>,_int>)(_Tuple_impl<1UL,_int>)0x0;
    _Var13 = std::
             find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::less<int>(std::_Placeholder<1>,int)>>
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,&local_1c0);
    if ((_Var12._M_current !=
         bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) ||
       (_Var13._M_current !=
        bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
      std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
      poVar19 = std::operator<<(poVar19,(string *)&allBends);
      poVar19 = std::operator<<(poVar19," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont_00);
      poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
      std::operator<<(poVar19," have invalid indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allBends);
      pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
      __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    bVar10 = hasDuplicateElement<std::vector<int,std::allocator<int>>>
                       ((vector<int,_std::allocator<int>_> *)
                        &bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
    if (bVar10) {
      poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
      std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
      poVar19 = std::operator<<(poVar19,(string *)&allBends);
      poVar19 = std::operator<<(poVar19," : atoms of bend");
      containerToString<std::vector<int,std::allocator<int>>>
                ((string *)&ghostIndex,(OpenMD *)&bendAtoms,cont_01);
      poVar19 = std::operator<<(poVar19,(string *)&ghostIndex);
      std::operator<<(poVar19," have duplicated indices\n");
      std::__cxx11::string::~string((string *)&ghostIndex);
      std::__cxx11::string::~string((string *)&allBends);
      pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
      __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    lVar14 = (long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    if (lVar14 == 3) {
      if (*(char *)(lVar5 + 0x92) == '\0') {
        poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar19 = std::operator<<(poVar19,(string *)&allBends);
        std::operator<<(poVar19,": normal bend should not have ghostVectorSouce\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
        __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    else if (lVar14 == 2) {
      if (*(char *)(lVar5 + 0x92) == '\x01') {
        poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar19 = std::operator<<(poVar19,(string *)&allBends);
        std::operator<<(poVar19,": ghostVectorSouce is missing\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
        __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      ghostIndex = (size_t)*(int *)(lVar5 + 0x94);
      if ((ulong)((long)(this->atomStamps_).
                        super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->atomStamps_).
                        super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= ghostIndex) {
        poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar19 = std::operator<<(poVar19,(string *)&allBends);
        poVar19 = std::operator<<(poVar19,": ghostVectorSource ");
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        std::operator<<(poVar19,"  is invalid\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
        __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      _Var12 = std::
               __find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                         (bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish,&ghostIndex);
      if (_Var12._M_current ==
          bendAtoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar19 = std::operator<<(poVar19,(string *)&allBends);
        poVar19 = std::operator<<(poVar19,": ghostVectorSouce ");
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        std::operator<<(poVar19,"is invalid\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
        __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
      if ((this->atomStamps_).
          super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>._M_impl.
          super__Vector_impl_data._M_start[(int)ghostIndex]->haveOrt_ == false) {
        poVar19 = std::operator<<((ostream *)&oss,"Error in Molecule ");
        std::__cxx11::string::string((string *)&allBends,(string *)&(this->Name).data_);
        poVar19 = std::operator<<(poVar19,(string *)&allBends);
        std::operator<<(poVar19,": ghost atom must be a directional atom\n");
        std::__cxx11::string::~string((string *)&allBends);
        pOVar20 = (OpenMDException *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        OpenMDException::OpenMDException(pOVar20,(string *)&allBends);
        __cxa_throw(pOVar20,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&bendAtoms.super__Vector_base<int,_std::allocator<int>_>);
    uVar22 = uVar22 + 1;
    lVar23 = lVar23 + 0x100000000;
  } while( true );
}

Assistant:

void MoleculeStamp::checkBends() {
    std::ostringstream oss;
    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      std::vector<int>::iterator k =
          std::find_if(bendAtoms.begin(), bendAtoms.end(),
                       std::bind(std::less<int>(), std::placeholders::_1, 0));

      if (j != bendAtoms.end() || k != bendAtoms.end()) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have invalid indices\n";
        throw OpenMDException(oss.str());
      }

      if (hasDuplicateElement(bendAtoms)) {
        oss << "Error in Molecule " << getName() << " : atoms of bend"
            << containerToString(bendAtoms) << " have duplicated indices\n";
        throw OpenMDException(oss.str());
      }

      if (bendAtoms.size() == 2) {
        if (!bendStamp->haveGhostVectorSource()) {
          oss << "Error in Molecule " << getName()
              << ": ghostVectorSouce is missing\n";
          throw OpenMDException(oss.str());
        } else {
          std::size_t ghostIndex = bendStamp->getGhostVectorSource();
          if (ghostIndex < getNAtoms()) {
            if (std::find(bendAtoms.begin(), bendAtoms.end(), ghostIndex) ==
                bendAtoms.end()) {
              oss << "Error in Molecule " << getName() << ": ghostVectorSouce "
                  << ghostIndex << "is invalid\n";
              throw OpenMDException(oss.str());
            }
            if (!getAtomStamp(ghostIndex)->haveOrientation()) {
              oss << "Error in Molecule " << getName()
                  << ": ghost atom must be a directional atom\n";
              throw OpenMDException(oss.str());
            }
          } else {
            oss << "Error in Molecule " << getName() << ": ghostVectorSource "
                << ghostIndex << "  is invalid\n";
            throw OpenMDException(oss.str());
          }
        }
      } else if (bendAtoms.size() == 3 && bendStamp->haveGhostVectorSource()) {
        oss << "Error in Molecule " << getName()
            << ": normal bend should not have ghostVectorSouce\n";
        throw OpenMDException(oss.str());
      }
    }

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp       = getBendStamp(i);
      std::vector<int> bendAtoms = bendStamp->getMembers();
      std::vector<int> rigidSet(getNRigidBodies(), 0);
      std::vector<int>::iterator j;
      for (j = bendAtoms.begin(); j != bendAtoms.end(); ++j) {
        int rigidbodyIndex = atom2Rigidbody[*j];
        if (rigidbodyIndex >= 0) {
          ++rigidSet[rigidbodyIndex];
          if (rigidSet[rigidbodyIndex] > 2) {
            oss << "Error in Molecule " << getName() << ": bend"
                << containerToString(bendAtoms)
                << "has three atoms on the same rigid body\n";
            throw OpenMDException(oss.str());
          }
        }
      }
    }

    std::set<std::tuple<int, int, int>> allBends;
    std::set<std::tuple<int, int, int>>::iterator iter;

    for (std::size_t i = 0; i < getNBends(); ++i) {
      BendStamp* bendStamp  = getBendStamp(i);
      std::vector<int> bend = bendStamp->getMembers();
      if (bend.size() == 2) {
        // in case we have two ghost bend. For example,
        // bend {
        // members (0, 1);
        //   ghostVectorSource = 0;
        // }
        // and
        // bend {
        //   members (0, 1);
        // ghostVectorSource = 0;
        // }
        // In order to distinguish them. we expand them to Tuple3.
        // the first one is expanded to (0, 0, 1) while the second one
        // is expaned to (0, 1, 1)
        int ghostIndex = bendStamp->getGhostVectorSource();
        std::vector<int>::iterator j =
            std::find(bend.begin(), bend.end(), ghostIndex);
        if (j != bend.end()) { bend.insert(j, ghostIndex); }
      }

      std::tuple<int, int, int> bendTuple {bend[0], bend[1], bend[2]};
      auto& [first, second, third] = bendTuple;

      // make sure the first element of bendTuple is always less than or equal
      // to the third element of bendTuple
      if (first > third) { std::swap(first, third); }

      iter = allBends.find(bendTuple);
      if (iter != allBends.end()) {
        oss << "Error in Molecule " << getName() << ": "
            << "Bend" << containerToString(bend) << " appears multiple times\n";
        throw OpenMDException(oss.str());
      } else {
        allBends.insert(bendTuple);
      }
    }

    for (std::size_t i = 0; i < getNBonds(); ++i) {
      BondStamp* bondStamp = getBondStamp(i);
      int a                = bondStamp->getA();
      int b                = bondStamp->getB();

      AtomStamp* atomA = getAtomStamp(a);
      AtomStamp* atomB = getAtomStamp(b);

      // find bend c--a--b
      AtomStamp::AtomIter ai;
      for (int c = atomA->getFirstBondedAtom(ai); c != -1;
           c     = atomA->getNextBondedAtom(ai)) {
        if (b == c) continue;

        std::tuple<int, int, int> newBend {c, a, b};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }

      // find bend a--b--c
      for (int c = atomB->getFirstBondedAtom(ai); c != -1;
           c     = atomB->getNextBondedAtom(ai)) {
        if (a == c) continue;

        std::tuple<int, int, int> newBend {a, b, c};
        auto [first, second, third] = newBend;
        if (first > third) { std::swap(first, third); }

        if (allBends.find(newBend) == allBends.end()) {
          allBends.insert(newBend);
          BendStamp* newBendStamp = new BendStamp();
          newBendStamp->setMembers(newBend);
          addBendStamp(newBendStamp);
        }
      }
    }
  }